

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRecognizer.cpp
# Opt level: O0

Encodings xercesc_4_0::XMLRecognizer::basicEncodingProbe(XMLByte *rawBuffer,XMLSize_t rawByteCount)

{
  int iVar1;
  XMLSize_t rawByteCount_local;
  XMLByte *rawBuffer_local;
  
  if ((rawByteCount < 6) || (iVar1 = memcmp(rawBuffer,"<?xml ",6), iVar1 != 0)) {
    if (rawByteCount < 2) {
      rawBuffer_local._4_4_ = UTF_8;
    }
    else if (rawByteCount < 4) {
      if ((*rawBuffer == 0xfe) && (rawBuffer[1] == 0xff)) {
        rawBuffer_local._4_4_ = UTF_16B;
      }
      else if ((*rawBuffer == 0xff) && (rawBuffer[1] == 0xfe)) {
        rawBuffer_local._4_4_ = UTF_16L;
      }
      else {
        rawBuffer_local._4_4_ = UTF_8;
      }
    }
    else if ((((*rawBuffer == '\0') && (rawBuffer[1] == '\0')) && (rawBuffer[2] == 0xfe)) &&
            (rawBuffer[3] == 0xff)) {
      rawBuffer_local._4_4_ = UCS_4B;
    }
    else if (((*rawBuffer == 0xff) && (rawBuffer[1] == 0xfe)) &&
            ((rawBuffer[2] == '\0' && (rawBuffer[3] == '\0')))) {
      rawBuffer_local._4_4_ = UCS_4L;
    }
    else if ((*rawBuffer == 0xfe) && (rawBuffer[1] == 0xff)) {
      rawBuffer_local._4_4_ = UTF_16B;
    }
    else if ((*rawBuffer == 0xff) && (rawBuffer[1] == 0xfe)) {
      rawBuffer_local._4_4_ = UTF_16L;
    }
    else {
      if ((*rawBuffer == '\0') || (*rawBuffer == '<')) {
        if ((0x17 < rawByteCount) && (iVar1 = memcmp(rawBuffer,fgUCS4BPre,0x18), iVar1 == 0)) {
          return UCS_4B;
        }
        if ((0x17 < rawByteCount) && (iVar1 = memcmp(rawBuffer,fgUCS4LPre,0x18), iVar1 == 0)) {
          return UCS_4L;
        }
        if ((0xb < rawByteCount) && (iVar1 = memcmp(rawBuffer,fgUTF16BPre,0xc), iVar1 == 0)) {
          return UTF_16B;
        }
        if ((0xb < rawByteCount) && (iVar1 = memcmp(rawBuffer,fgUTF16LPre,0xc), iVar1 == 0)) {
          return UTF_16L;
        }
      }
      if ((rawByteCount < 7) || (iVar1 = memcmp(rawBuffer,&fgEBCDICPre,6), iVar1 != 0)) {
        rawBuffer_local._4_4_ = UTF_8;
      }
      else {
        rawBuffer_local._4_4_ = EBCDIC;
      }
    }
  }
  else {
    rawBuffer_local._4_4_ = UTF_8;
  }
  return rawBuffer_local._4_4_;
}

Assistant:

XMLRecognizer::Encodings
XMLRecognizer::basicEncodingProbe(  const   XMLByte* const  rawBuffer
                                    , const XMLSize_t       rawByteCount)
{
    //
    //  As an optimization to check the 90% case, check first for the ASCII
    //  sequence '<?xml', which means its either US-ASCII, UTF-8, or some
    //  other encoding that we don't do manually but which happens to share
    //  the US-ASCII code points for these characters. So just return UTF-8
    //  to get us through the first line.
    //
    if (rawByteCount >= fgASCIIPreLen)
    {
        if (!memcmp(rawBuffer, fgASCIIPre, fgASCIIPreLen))
            return UTF_8;
    }

    //
    //  If the count of raw bytes is less than 2, it cannot be anything
    //  we understand, so return UTF-8 as a fallback.
    //
    if (rawByteCount < 2)
        return UTF_8;
         
    //  
    //  We have two to four bytes, so lets check for a UTF-16 BOM. That
    //  is quick to check and enough to identify two major encodings.   
    // 

    if (rawByteCount < 4)
    {
        if ((rawBuffer[0] == 0xFE) && (rawBuffer[1] == 0xFF))
            return UTF_16B;
        else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE))
            return UTF_16L;
        else 
            return UTF_8;
    }

    /***
     *    F.1 Detection Without External Encoding Information
     *
     *    Because each XML entity not accompanied by external encoding information and 
     *    not in UTF-8 or UTF-16 encoding must begin with an XML encoding declaration, 
     *    in which the first characters must be '<?xml', any conforming processor can detect, 
     *    after two to four octets of input, which of the following cases apply. 
     *
     *    In reading this list, it may help to know that in UCS-4, '<' is "#x0000003C" and 
     *    '?' is "#x0000003F", and the Byte Order Mark required of UTF-16 data streams is 
     *    "#xFEFF". The notation ## is used to denote any byte value except that two consecutive 
     *    ##s cannot be both 00.
     *
     *    With a Byte Order Mark:
     *
     *    00 00 FE FF           UCS-4,    big-endian machine    (1234 order) 
     *    FF FE 00 00           UCS-4,    little-endian machine (4321 order) 
     *    00 00 FF FE           UCS-4,    unusual octet order   (2143) 
     *    FE FF 00 00           UCS-4,    unusual octet order   (3412) 
     *    FE FF ## ##           UTF-16,   big-endian 
     *    FF FE ## ##           UTF-16,   little-endian 
     *    EF BB BF              UTF-8 
     *
     ***/

    //
    //  We have at least four bytes, so we can check all BOM
    //  for UCS-4BE, UCS-4LE, UTF-16BE and UTF-16LE as well.
    //
    if ((rawBuffer[0] == 0x00) && (rawBuffer[1] == 0x00) && (rawBuffer[2] == 0xFE) && (rawBuffer[3] == 0xFF))
        return UCS_4B;
    else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE) && (rawBuffer[2] == 0x00) && (rawBuffer[3] == 0x00))
        return UCS_4L;
    else if ((rawBuffer[0] == 0xFE) && (rawBuffer[1] == 0xFF))
        return UTF_16B;
    else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE))
        return UTF_16L;

    //
    //  We have at least 4 bytes. So lets check the 4 byte sequences that
    //  indicate other UTF-16 and UCS encodings.
    //
    if ((rawBuffer[0] == 0x00) || (rawBuffer[0] == 0x3C))
    {
        if (rawByteCount >= fgUCS4PreLen && !memcmp(rawBuffer, fgUCS4BPre, fgUCS4PreLen))
            return UCS_4B;
        else if (rawByteCount >= fgUCS4PreLen && !memcmp(rawBuffer, fgUCS4LPre, fgUCS4PreLen))
            return UCS_4L;
        else if (rawByteCount >= fgUTF16PreLen && !memcmp(rawBuffer, fgUTF16BPre, fgUTF16PreLen))
            return UTF_16B;
        else if (rawByteCount >= fgUTF16PreLen && !memcmp(rawBuffer, fgUTF16LPre, fgUTF16PreLen))
            return UTF_16L;
    }

    //
    //  See if we have enough bytes to possibly match the EBCDIC prefix.
    //  If so, try it.
    //
    if (rawByteCount > fgEBCDICPreLen)
    {
        if (!memcmp(rawBuffer, fgEBCDICPre, fgEBCDICPreLen))
            return EBCDIC;
    }

    //
    //  Does not seem to be anything we know, so go with UTF-8 to get at
    //  least through the first line and see what it really is.
    //
    return UTF_8;
}